

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Thread.cpp
# Opt level: O2

bool __thiscall chatra::Thread::conditionalOperator(Thread *this)

{
  pointer *pppVar1;
  bool bVar2;
  pointer pFVar3;
  pointer ppVar4;
  Node *pNVar5;
  ReferenceNode *pRVar6;
  EvaluateValueResult EVar7;
  undefined8 *puVar8;
  string local_78;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_58;
  allocator local_31;
  
  pFVar3 = (this->frames).super__Vector_base<chatra::Frame,_std::allocator<chatra::Frame>_>._M_impl.
           super__Vector_impl_data._M_finish;
  ppVar4 = pFVar3[-1].stack.
           super__Vector_base<std::pair<chatra::Node_*,_unsigned_long>,_std::allocator<std::pair<chatra::Node_*,_unsigned_long>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pNVar5 = ppVar4[-1].first;
  if (ppVar4[-1].second == 1) {
    EVar7 = evaluateValue(this,Value);
    if (EVar7 == Suspend) {
      return false;
    }
    if (EVar7 == StackChanged) {
      return true;
    }
  }
  else if (ppVar4[-1].second == 0) {
    ppVar4[-1].second = 1;
    local_78._M_dataplus._M_p =
         (pointer)(((pNVar5->subNodes).
                    super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                    ._M_impl.super__Vector_impl_data._M_start)->
                  super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    goto LAB_001562d0;
  }
  pRVar6 = (pFVar3[-1].values.
            super__Vector_base<chatra::TemporaryObject_*,_std::allocator<chatra::TemporaryObject_*>_>
            ._M_impl.super__Vector_impl_data._M_finish[-1]->targetRef).node;
  if (pRVar6->type != Bool) {
    pNVar5 = (((pNVar5->subNodes).
               super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->
             super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    std::__cxx11::string::string
              ((string *)&local_78,"conditional operator requires Bool expression",&local_31);
    local_58.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_58.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_58.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    errorAtNode(&this->super_IErrorReceiver,Error,pNVar5,&local_78,&local_58);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_58);
    std::__cxx11::string::~string((string *)&local_78);
    puVar8 = (undefined8 *)__cxa_allocate_exception(0x10);
    *puVar8 = &PTR__exception_0023dab8;
    *(undefined4 *)(puVar8 + 1) = 0x88;
    __cxa_throw(puVar8,&RuntimeException::typeinfo,std::exception::~exception);
  }
  bVar2 = (pRVar6->field_3).vBool;
  Frame::pop(pFVar3 + -1);
  pppVar1 = &pFVar3[-1].stack.
             super__Vector_base<std::pair<chatra::Node_*,_unsigned_long>,_std::allocator<std::pair<chatra::Node_*,_unsigned_long>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  *pppVar1 = *pppVar1 + -1;
  local_78._M_dataplus._M_p =
       *(pointer *)
        ((long)&(((pNVar5->subNodes).
                  super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)->
                super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr +
        (ulong)((2 - (uint)bVar2) * 0x10));
LAB_001562d0:
  local_58.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)((ulong)local_58.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start._4_4_ << 0x20);
  std::
  vector<std::pair<chatra::Node*,unsigned_long>,std::allocator<std::pair<chatra::Node*,unsigned_long>>>
  ::emplace_back<chatra::Node*,int>
            ((vector<std::pair<chatra::Node*,unsigned_long>,std::allocator<std::pair<chatra::Node*,unsigned_long>>>
              *)&pFVar3[-1].stack,(Node **)&local_78,(int *)&local_58);
  return true;
}

Assistant:

bool Thread::conditionalOperator() {
	auto& f = frames.back();
	auto* node = f.stack.back().first;
	auto& nodePhase = f.stack.back().second;

	switch (nodePhase) {
	case 0:  nodePhase++;  f.stack.emplace_back(node->subNodes[0].get(), 0);  return true;
	case 1:  CHATRA_EVALUATE_VALUE;
	default: {
		auto ref = f.values.back()->getRef();
		if (ref.valueType() != ReferenceValueType::Bool) {
			errorAtNode(*this, ErrorLevel::Error, node->subNodes[0].get(),
					"conditional operator requires Bool expression", {});
			throw RuntimeException(StringId::TypeMismatchException);
		}
		size_t nextIndex = (ref.getBool() ? 1 : 2);
		f.pop();
		f.stack.pop_back();
		f.stack.emplace_back(node->subNodes[nextIndex].get(), 0);
		return true;
	}
	}
}